

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Node * init_desg_expr(C_Parser *parser,InitDesg *desg,C_Token *tok)

{
  int iVar1;
  C_Obj *pCVar2;
  C_Member *pCVar3;
  C_Node *pCVar4;
  C_Node *pCVar5;
  
  pCVar2 = desg->var;
  if (pCVar2 == (C_Obj *)0x0) {
    pCVar3 = desg->member;
    pCVar5 = init_desg_expr(parser,desg->next,tok);
    if (pCVar3 == (C_Member *)0x0) {
      iVar1 = desg->idx;
      pCVar4 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar4->kind = ND_NUM;
      pCVar4->tok = tok;
      pCVar4->val = (long)iVar1;
      pCVar5 = new_add(parser,pCVar5,pCVar4,tok);
      pCVar4 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar4->kind = ND_DEREF;
      pCVar4->tok = tok;
      pCVar4->lhs = pCVar5;
    }
    else {
      pCVar4 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar4->kind = ND_MEMBER;
      pCVar4->tok = tok;
      pCVar4->lhs = pCVar5;
      pCVar4->member = desg->member;
    }
  }
  else {
    pCVar4 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar4->kind = ND_VAR;
    pCVar4->tok = tok;
    pCVar4->var = pCVar2;
  }
  return pCVar4;
}

Assistant:

static C_Node *init_desg_expr(C_Parser *parser, InitDesg *desg, C_Token *tok) {
  if (desg->var)
    return new_var_node(parser, desg->var, tok);

  if (desg->member) {
    C_Node *node = new_unary(parser, ND_MEMBER, init_desg_expr(parser, desg->next, tok), tok);
    node->member = desg->member;
    return node;
  }

  C_Node *lhs = init_desg_expr(parser, desg->next, tok);
  C_Node *rhs = new_num(parser, desg->idx, tok);
  return new_unary(parser, ND_DEREF, new_add(parser, lhs, rhs, tok), tok);
}